

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::LocalObjectAddressForSlot::LocalObjectAddressForSlot
          (LocalObjectAddressForSlot *this,ScopeSlots *_pSlotArray,int _slotIndex,Var _value)

{
  Var _value_local;
  int _slotIndex_local;
  ScopeSlots *_pSlotArray_local;
  LocalObjectAddressForSlot *this_local;
  
  IDiagObjectAddress::IDiagObjectAddress(&this->super_IDiagObjectAddress);
  (this->super_IDiagObjectAddress)._vptr_IDiagObjectAddress = (_func_int **)&PTR_Set_01dea808;
  ScopeSlots::ScopeSlots(&this->slotArray,_pSlotArray);
  this->slotIndex = _slotIndex;
  this->value = _value;
  return;
}

Assistant:

LocalObjectAddressForSlot::LocalObjectAddressForSlot(ScopeSlots _pSlotArray, int _slotIndex, Js::Var _value)
        : slotArray(_pSlotArray),
          slotIndex(_slotIndex),
          value(_value)
    {
    }